

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

reference __thiscall
andres::View<short,false,std::allocator<unsigned_long>>::operator()
          (View<short,false,std::allocator<unsigned_long>> *this,size_t value,unsigned_long args,
          unsigned_long args_1)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  bool assertion;
  
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)this);
  if (*(long *)this == 0) {
    assertion = false;
  }
  else {
    sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<short,_false,_std::allocator<unsigned_long>_> *)this);
    assertion = sVar2 == 3;
  }
  marray_detail::Assert<bool>(assertion);
  lVar1 = *(long *)this;
  sVar2 = View<short,_false,_std::allocator<unsigned_long>_>::strides
                    ((View<short,_false,_std::allocator<unsigned_long>_> *)this,0);
  sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::elementAccessHelper<unsigned_long>
                    ((View<short,_false,_std::allocator<unsigned_long>_> *)this,3,args,args_1);
  return (reference)(sVar2 * value * 2 + lVar1 + sVar3 * 2);
}

Assistant:

inline typename View<T, isConst, A>::reference
View<T, isConst, A>::operator()
(
    const std::size_t value, 
    const Args... args
) const
{
    testInvariant();
    marray_detail::Assert( MARRAY_NO_DEBUG || ( data_ != 0 && sizeof...(args)+1 == dimension() ) );
    return data_[ strides(0) * static_cast<std::size_t>(value) 
        + static_cast<std::size_t>(elementAccessHelper(sizeof...(args)+1, args...)) ];
}